

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O0

void __thiscall
capnp::PackedFdMessageReader::PackedFdMessageReader
          (PackedFdMessageReader *this,OwnFd *fd,ReaderOptions options,
          ArrayPtr<capnp::word> scratchSpace)

{
  ArrayPtr<capnp::word> scratchSpace_00;
  OwnFd *other;
  ReaderOptions options_00;
  ArrayPtr<unsigned_char> local_60 [2];
  OwnFd local_3c;
  OwnFd *local_38;
  OwnFd *fd_local;
  PackedFdMessageReader *this_local;
  ArrayPtr<capnp::word> scratchSpace_local;
  ReaderOptions options_local;
  
  scratchSpace_local.ptr = (word *)scratchSpace.size_;
  this_local = (PackedFdMessageReader *)scratchSpace.ptr;
  scratchSpace_local.size_ = options.traversalLimitInWords;
  options_00.nestingLimit = options.nestingLimit;
  local_38 = fd;
  fd_local = (OwnFd *)this;
  other = kj::mv<kj::OwnFd>(fd);
  kj::OwnFd::OwnFd(&local_3c,other);
  kj::FdInputStream::FdInputStream(&this->super_FdInputStream,&local_3c);
  kj::OwnFd::~OwnFd(&local_3c);
  (this->super_FdInputStream).super_InputStream._vptr_InputStream =
       (_func_int **)&PTR__PackedFdMessageReader_0059e878;
  (this->super_BufferedInputStreamWrapper).super_BufferedInputStream.super_InputStream.
  _vptr_InputStream = (_func_int **)&DAT_0059e8a8;
  (this->super_PackedMessageReader).super_PackedInputStream.super_InputStream._vptr_InputStream =
       (_func_int **)&PTR__PackedFdMessageReader_0059e8e0;
  (this->super_PackedMessageReader).super_InputStreamMessageReader.super_MessageReader.
  _vptr_MessageReader = (_func_int **)&PTR__PackedFdMessageReader_0059e910;
  kj::ArrayPtr<unsigned_char>::ArrayPtr(local_60,(void *)0x0);
  kj::BufferedInputStreamWrapper::BufferedInputStreamWrapper
            (&this->super_BufferedInputStreamWrapper,(InputStream *)this,local_60[0]);
  (this->super_FdInputStream).super_InputStream._vptr_InputStream =
       (_func_int **)&PTR__PackedFdMessageReader_0059e878;
  (this->super_BufferedInputStreamWrapper).super_BufferedInputStream.super_InputStream.
  _vptr_InputStream = (_func_int **)&DAT_0059e8a8;
  (this->super_PackedMessageReader).super_PackedInputStream.super_InputStream._vptr_InputStream =
       (_func_int **)&PTR__PackedFdMessageReader_0059e8e0;
  (this->super_PackedMessageReader).super_InputStreamMessageReader.super_MessageReader.
  _vptr_MessageReader = (_func_int **)&PTR__PackedFdMessageReader_0059e910;
  options_00.traversalLimitInWords = scratchSpace_local.size_;
  scratchSpace_00.size_ = (size_t)scratchSpace_local.ptr;
  scratchSpace_00.ptr = (word *)this_local;
  options_00._12_4_ = 0;
  PackedMessageReader::PackedMessageReader
            (&this->super_PackedMessageReader,
             &(this->super_BufferedInputStreamWrapper).super_BufferedInputStream,options_00,
             scratchSpace_00);
  (this->super_FdInputStream).super_InputStream._vptr_InputStream =
       (_func_int **)&PTR__PackedFdMessageReader_0059e878;
  (this->super_BufferedInputStreamWrapper).super_BufferedInputStream.super_InputStream.
  _vptr_InputStream = (_func_int **)&DAT_0059e8a8;
  (this->super_PackedMessageReader).super_PackedInputStream.super_InputStream._vptr_InputStream =
       (_func_int **)&PTR__PackedFdMessageReader_0059e8e0;
  (this->super_PackedMessageReader).super_InputStreamMessageReader.super_MessageReader.
  _vptr_MessageReader = (_func_int **)&PTR__PackedFdMessageReader_0059e910;
  return;
}

Assistant:

PackedFdMessageReader::PackedFdMessageReader(
    kj::OwnFd fd, ReaderOptions options, kj::ArrayPtr<word> scratchSpace)
    : FdInputStream(kj::mv(fd)),
      BufferedInputStreamWrapper(static_cast<FdInputStream&>(*this)),
      PackedMessageReader(static_cast<BufferedInputStreamWrapper&>(*this),
                          options, scratchSpace) {}